

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O3

void __thiscall asl::XdlEncoder::new_property(XdlEncoder *this,String *name)

{
  anon_union_16_2_78e7fdac_for_String_2 *b;
  char *b_00;
  
  if (name->_size == 0) {
    b = &name->field_2;
  }
  else {
    b = (anon_union_16_2_78e7fdac_for_String_2 *)(name->field_2)._str;
  }
  if (this->_json == true) {
    new_string(this,b->_space);
    b_00 = ":";
    if (this->_pretty != false) {
      b_00 = ": ";
    }
    String::append(&this->_out,b_00,this->_pretty + 1);
    return;
  }
  String::append(&this->_out,b->_space,name->_len);
  String::operator+=(&this->_out,'=');
  return;
}

Assistant:

void XdlEncoder::new_property(const String& name)
{
	if (_json)
	{
		new_string(name);
		_out << (_pretty ? ": " : ":");
	}
	else
		_out << name << '=';
}